

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_decoder.cc
# Opt level: O1

bool __thiscall draco::MeshSequentialDecoder::DecodeConnectivity(MeshSequentialDecoder *this)

{
  long lVar1;
  pointer *ppaVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  DecoderBuffer *pDVar8;
  Mesh *pMVar9;
  iterator iVar10;
  uint uVar11;
  bool bVar12;
  int j;
  long lVar13;
  uint8_t val;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  Face face;
  uint32_t num_points;
  uint32_t num_faces;
  uint32_t val_2;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> local_48;
  uint local_3c;
  uint local_38;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_34;
  
  uVar5._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar5._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  pDVar8 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((ushort)(uVar5 << 8 | uVar5 >> 8) < 0x202) {
    lVar15 = pDVar8->pos_;
    lVar14 = lVar15 + 4;
    if (pDVar8->data_size_ < lVar14) {
      return false;
    }
    local_38 = *(uint *)(pDVar8->data_ + lVar15);
    pDVar8->pos_ = lVar14;
    if (pDVar8->data_size_ < lVar15 + 8) {
      return false;
    }
    local_3c = *(uint *)(pDVar8->data_ + lVar14);
    pDVar8->pos_ = lVar15 + 8;
  }
  else {
    bVar12 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>(1,&local_38,pDVar8);
    if (!bVar12) {
      return false;
    }
    bVar12 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>
                       (1,&local_3c,(this->super_MeshDecoder).super_PointCloudDecoder.buffer_);
    if (!bVar12) {
      return false;
    }
  }
  uVar11 = local_38;
  uVar17 = (ulong)local_38;
  if (uVar17 < 0x55555556) {
    pDVar8 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    lVar14 = pDVar8->pos_;
    if ((uVar17 <= (ulong)((pDVar8->data_size_ - lVar14) / 3)) && (lVar14 + 1 <= pDVar8->data_size_)
       ) {
      cVar3 = pDVar8->data_[lVar14];
      pDVar8->pos_ = lVar14 + 1;
      if (cVar3 == '\0') {
        bVar12 = DecodeAndDecompressIndices(this,local_38);
        if (!bVar12) {
          return false;
        }
      }
      else if (local_3c < 0x100) {
        if (uVar17 != 0) {
          uVar16 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            pDVar8 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
            lVar14 = pDVar8->data_size_;
            lVar13 = 0;
            lVar15 = pDVar8->pos_;
            do {
              lVar1 = lVar15 + 1;
              if (lVar14 < lVar1) {
                return false;
              }
              bVar4 = pDVar8->data_[lVar15];
              pDVar8->pos_ = lVar1;
              local_48._M_elems[lVar13].value_ = (uint)bVar4;
              lVar13 = lVar13 + 1;
              lVar15 = lVar1;
            } while (lVar13 != 3);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar2 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar2 = *ppaVar2 + 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar11);
        }
      }
      else if (local_3c < 0x10000) {
        if (uVar17 != 0) {
          uVar16 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            pDVar8 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
            lVar14 = pDVar8->data_size_;
            lVar13 = 0;
            lVar15 = pDVar8->pos_;
            do {
              lVar1 = lVar15 + 2;
              if (lVar14 < lVar1) {
                return false;
              }
              uVar5 = *(ushort *)(pDVar8->data_ + lVar15);
              pDVar8->pos_ = lVar1;
              local_48._M_elems[lVar13].value_ = (uint)uVar5;
              lVar13 = lVar13 + 1;
              lVar15 = lVar1;
            } while (lVar13 != 3);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar2 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar2 = *ppaVar2 + 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar11);
        }
      }
      else if ((local_3c < 0x200000) &&
              (uVar6._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_,
              uVar6._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_,
              0x201 < (ushort)(uVar6 << 8 | uVar6 >> 8))) {
        if (uVar17 != 0) {
          uVar16 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            lVar14 = 0;
            do {
              bVar12 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>
                                 (1,&local_34.value_,
                                  (this->super_MeshDecoder).super_PointCloudDecoder.buffer_);
              if (!bVar12) {
                return false;
              }
              local_48._M_elems[lVar14].value_ = local_34.value_;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar2 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar2 = *ppaVar2 + 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar11);
        }
      }
      else if (uVar17 != 0) {
        uVar16 = 0;
        do {
          local_48._M_elems[2].value_ = 0;
          local_48._M_elems[0].value_ = 0;
          local_48._M_elems[1].value_ = 0;
          pDVar8 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
          lVar14 = pDVar8->data_size_;
          lVar13 = 0;
          lVar15 = pDVar8->pos_;
          do {
            lVar1 = lVar15 + 4;
            if (lVar14 < lVar1) {
              return false;
            }
            uVar7 = *(uint *)(pDVar8->data_ + lVar15);
            pDVar8->pos_ = lVar1;
            local_48._M_elems[lVar13].value_ = uVar7;
            lVar13 = lVar13 + 1;
            lVar15 = lVar1;
          } while (lVar13 != 3);
          pMVar9 = (this->super_MeshDecoder).mesh_;
          iVar10._M_current =
               (pMVar9->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pMVar9->faces_).vector_.
              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
            ::
            _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                      ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                        *)&pMVar9->faces_,iVar10,&local_48);
          }
          else {
            (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
            *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
            ppaVar2 = &(pMVar9->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar11);
      }
      ((this->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ = local_3c;
      return true;
    }
  }
  return false;
}

Assistant:

bool MeshSequentialDecoder::DecodeConnectivity() {
  uint32_t num_faces;
  uint32_t num_points;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer()->Decode(&num_faces)) {
      return false;
    }
    if (!buffer()->Decode(&num_points)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, buffer())) {
      return false;
    }
    if (!DecodeVarint(&num_points, buffer())) {
      return false;
    }
  }

  // Check that num_faces and num_points are valid values.
  const uint64_t faces_64 = static_cast<uint64_t>(num_faces);
  // Compressed sequential encoding can only handle (2^32 - 1) / 3 indices.
  if (faces_64 > 0xffffffff / 3) {
    return false;
  }
  if (faces_64 > buffer()->remaining_size() / 3) {
    // The number of faces is unreasonably high, because face indices do not
    // fit in the remaining size of the buffer.
    return false;
  }
  uint8_t connectivity_method;
  if (!buffer()->Decode(&connectivity_method)) {
    return false;
  }
  if (connectivity_method == 0) {
    if (!DecodeAndDecompressIndices(num_faces)) {
      return false;
    }
  } else {
    if (num_points < 256) {
      // Decode indices as uint8_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint8_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 16)) {
      // Decode indices as uint16_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint16_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 21) &&
               bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 2)) {
      // Decode indices as uint32_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!DecodeVarint(&val, buffer())) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else {
      // Decode faces as uint32_t (default).
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    }
  }
  point_cloud()->set_num_points(num_points);
  return true;
}